

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

void __thiscall basisu::job_pool::add_job(job_pool *this,function<void_()> *job)

{
  size_type sVar1;
  unique_lock<std::mutex> *in_RDI;
  size_t queue_size;
  unique_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  function<void_()> *in_stack_ffffffffffffffc8;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
  *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_RDI,in_stack_ffffffffffffffb8);
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar1 = std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::size
                    ((vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                     &in_RDI[1]._M_owns);
  std::unique_lock<std::mutex>::unlock(in_RDI);
  if (1 < sVar1) {
    std::condition_variable::notify_one();
  }
  std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  return;
}

Assistant:

void job_pool::add_job(std::function<void()>&& job)
	{
		std::unique_lock<std::mutex> lock(m_mutex);

		m_queue.emplace_back(std::move(job));
						
		const size_t queue_size = m_queue.size();

		lock.unlock();

		if (queue_size > 1)
		{
			m_has_work.notify_one();
		}
	}